

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string __thiscall mjs::operator+(mjs *this,string *l,string *r)

{
  gc_heap *h;
  undefined8 extraout_RDX;
  string sVar1;
  allocator<wchar_t> local_aa;
  allocator<wchar_t> local_a9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  wstring_view local_48;
  wstring_view local_38;
  wstring_view local_28;
  
  h = (l->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  local_38 = string::view(l);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_68,&local_38,&local_a9);
  local_48 = string::view(r);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_88,&local_48,&local_aa);
  std::operator+(&local_a8,&local_68,&local_88);
  local_28._M_len = local_a8._M_string_length;
  local_28._M_str = local_a8._M_dataplus._M_p;
  string::string((string *)this,h,&local_28);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_88);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

inline string operator+(const string& l, const string& r) {
    // TODO: Optimize this
    return string{l.heap(), std::wstring{l.view()} + std::wstring{r.view()}};
}